

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  uchar *puVar1;
  int iVar2;
  j_compress_ptr in_RSI;
  long in_RDI;
  int m;
  int v2;
  int v;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr entropy;
  int local_40;
  int local_3c;
  int local_38;
  int in_stack_ffffffffffffffcc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  int val;
  JQUANT_TBL *pJVar6;
  uchar *st_00;
  
  st_00 = *(uchar **)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(st_00 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      *(undefined4 *)(st_00 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(st_00 + 100) = *(int *)(st_00 + 100) + 1;
      *(uint *)(st_00 + 100) = *(uint *)(st_00 + 100) & 7;
    }
    *(int *)(st_00 + 0x60) = *(int *)(st_00 + 0x60) + -1;
  }
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x170); iVar5 = iVar5 + 1) {
    pJVar6 = in_RSI->quant_tbl_ptrs[(long)iVar5 + -0xc];
    iVar4 = *(int *)(in_RDI + 0x174 + (long)iVar5 * 4);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x148 + (long)iVar4 * 8) + 0x14);
    iVar2 = (int)(short)pJVar6->quantval[0] >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    local_38 = iVar2 - *(int *)(st_00 + (long)iVar4 * 4 + 0x40);
    val = (int)((ulong)pJVar6 >> 0x20);
    if (local_38 == 0) {
      arith_encode(in_RSI,st_00,val);
      puVar1 = st_00 + (long)iVar4 * 4 + 0x50;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    else {
      *(int *)(st_00 + (long)iVar4 * 4 + 0x40) = iVar2;
      arith_encode(in_RSI,st_00,val);
      iVar2 = (int)((ulong)pJVar6 >> 0x20);
      if (local_38 < 1) {
        local_38 = -local_38;
        arith_encode(in_RSI,st_00,iVar2);
        puVar1 = st_00 + (long)iVar4 * 4 + 0x50;
        puVar1[0] = '\b';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
      }
      else {
        arith_encode(in_RSI,st_00,iVar2);
        puVar1 = st_00 + (long)iVar4 * 4 + 0x50;
        puVar1[0] = '\x04';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
      }
      local_40 = 0;
      local_3c = local_38 + -1;
      if (local_3c != 0) {
        arith_encode(in_RSI,st_00,(int)((ulong)pJVar6 >> 0x20));
        local_40 = 1;
        while (local_3c = local_3c >> 1, local_3c != 0) {
          arith_encode(in_RSI,st_00,(int)((ulong)pJVar6 >> 0x20));
          local_40 = local_40 << 1;
        }
      }
      arith_encode(in_RSI,st_00,(int)((ulong)pJVar6 >> 0x20));
      if (local_40 < (int)((1L << (*(byte *)(in_RDI + 0xc0 + (long)iVar3) & 0x3f)) >> 1)) {
        puVar1 = st_00 + (long)iVar4 * 4 + 0x50;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
      }
      else if ((int)((1L << (*(byte *)(in_RDI + 0xd0 + (long)iVar3) & 0x3f)) >> 1) < local_40) {
        *(int *)(st_00 + (long)iVar4 * 4 + 0x50) = *(int *)(st_00 + (long)iVar4 * 4 + 0x50) + 8;
      }
      while (local_40 = local_40 >> 1, local_40 != 0) {
        arith_encode(in_RSI,st_00,(int)((ulong)pJVar6 >> 0x20));
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2, temp3;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int)((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->last_dc_val[ci];
    entropy->last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */

    /* This is a well-known technique for obtaining the absolute value without
     * a branch.  It is derived from an assembly language technique presented
     * in "How to Optimize for the Pentium Processors", Copyright (c) 1996,
     * 1997 by Agner Fog.
     */
    temp3 = temp >> (CHAR_BIT * sizeof(int) - 1);
    temp ^= temp3;
    temp -= temp3;              /* temp is abs value of input */
    /* For a negative input, want temp2 = bitwise complement of abs(input) */
    temp2 = temp ^ temp3;

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = JPEG_NBITS(temp);
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS + 1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_symbol(entropy, compptr->dc_tbl_no, nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)                  /* emit_bits rejects calls with size 0 */
      emit_bits(entropy, (unsigned int)temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}